

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O1

Error * ot::commissioner::UnixTime::FromString
                  (Error *__return_storage_ptr__,UnixTime *aTime,string *aTimeStr)

{
  char *pcVar1;
  char *pcVar2;
  time_t tVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  tm lTm;
  string local_a8;
  pointer local_88;
  char *pcStack_80;
  size_t local_78;
  undefined8 local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  code *local_60;
  tm local_58;
  
  pcVar1 = strptime((aTimeStr->_M_dataplus)._M_p,kFmtString_abi_cxx11_,&local_58);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 != '\0')) {
    local_88 = (pointer)CONCAT44(local_88._4_4_,string_type);
    pcStack_80 = "ill formed time string {}";
    local_78 = 0x19;
    local_70._0_4_ = 0;
    local_70._4_4_ = 1;
    local_60 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar1 = "ill formed time string {}";
    local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_88;
    do {
      pcVar2 = pcVar1 + 1;
      if (*pcVar1 == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = pcVar1 + 2;
      }
      else if (*pcVar1 == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar1,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_88);
      }
      pcVar1 = pcVar2;
    } while (pcVar2 != "");
    local_88 = (aTimeStr->_M_dataplus)._M_p;
    pcStack_80 = (char *)aTimeStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x19;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)"ill formed time string {}",fmt,args);
    __return_storage_ptr__->mCode = kBadFormat;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mMessage,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  else {
    tVar3 = mktime(&local_58);
    aTime->mTime = tVar3;
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Error UnixTime::FromString(UnixTime &aTime, const std::string &aTimeStr)
{
    std::tm lTm;
    char   *result = strptime(aTimeStr.c_str(), kFmtString.c_str(), &lTm);
    if (result != nullptr && *result == '\000')
    {
        aTime = std::mktime(&lTm);
        return ERROR_NONE;
    }
    return ERROR_BAD_FORMAT("ill formed time string {}", aTimeStr);
}